

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib599.c
# Opt level: O2

int progress_callback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  int iVar1;
  
  iVar1 = 0;
  if ((0.0 < dltotal) && (dltotal < dlnow)) {
    curl_mprintf("%.0f > %.0f !!\n");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int progress_callback(void *clientp, double dltotal,
                             double dlnow, double ultotal, double ulnow)
{
  (void)clientp;
  (void)ulnow;
  (void)ultotal;

  if((dltotal > 0.0) && (dlnow > dltotal)) {
    /* this should not happen with test case 599 */
    printf("%.0f > %.0f !!\n", dltotal, dlnow);
    return -1;
  }

  return 0;
}